

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocket::setLocalCertificate(QSslSocket *this,QSslCertificate *certificate)

{
  QSslSocketPrivate *this_00;
  long in_FS_OFFSET;
  QSslSocketPrivate *d;
  QList<QSslCertificate> *t;
  QList<QSslCertificate> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QSslSocket *)0x3a237a);
  local_28.d.d = (Data *)0x0;
  local_28.d.ptr = (QSslCertificate *)0x0;
  local_28.d.size = 0;
  t = &local_28;
  QList<QSslCertificate>::QList((QList<QSslCertificate> *)0x3a239e);
  QList<QSslCertificate>::operator=((QList<QSslCertificate> *)this_00,t);
  QList<QSslCertificate>::~QList((QList<QSslCertificate> *)0x3a23bc);
  QList<QSslCertificate>::operator+=((QList<QSslCertificate> *)this_00,(parameter_type)t);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocket::setLocalCertificate(const QSslCertificate &certificate)
{
    Q_D(QSslSocket);
    d->configuration.localCertificateChain = QList<QSslCertificate>();
    d->configuration.localCertificateChain += certificate;
}